

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O3

void __thiscall cppcms::mount_point::mount_point(mount_point *this,selection_type sel,string *non)

{
  regex local_30 [8];
  
  booster::regex::regex(&this->host_);
  booster::regex::regex(&this->script_name_);
  booster::regex::regex(&this->path_info_);
  this->group_ = 0;
  this->selection_ = sel;
  (this->d).ptr_ = (_data *)0x0;
  if (sel == match_path_info) {
    booster::regex::regex(local_30,(string *)non,0);
    booster::regex::operator=(&this->script_name_,local_30);
  }
  else {
    booster::regex::regex(local_30,(string *)non,0);
    booster::regex::operator=(&this->path_info_,local_30);
  }
  booster::regex::~regex(local_30);
  return;
}

Assistant:

mount_point::mount_point(mount_point::selection_type sel,std::string const &non) :
	group_(0),
	selection_(sel)
{
	if(sel == match_path_info) {
		script_name_ = booster::regex(non);
	}
	else {
		path_info_ = booster::regex(non);
	}
}